

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O0

bool DiffTest<Blob<256>,Blob<128>>(pfHash hash,int diffbits,int reps,bool dumpCollisions)

{
  bool bVar1;
  byte in_CL;
  uint in_EDX;
  uint in_ESI;
  code *in_RDI;
  bool result;
  int i;
  Blob<128> h2;
  Blob<128> h1;
  Blob<256> k2;
  Blob<256> k1;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> diffs;
  Rand r;
  double expected;
  double testcount;
  double diffcount;
  int hashbits;
  int keybits;
  uint32_t in_stack_fffffffffffffefc;
  Rand *in_stack_ffffffffffffff00;
  Blob<256> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  int iVar2;
  Rand *this;
  int local_d0;
  int in_stack_ffffffffffffff3c;
  Blob<128> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  Blob<256> *in_stack_ffffffffffffff50;
  Blob<256> *in_stack_ffffffffffffff58;
  pfHash in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff70;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_ffffffffffffff78;
  Blob<256> local_80 [2];
  double local_38;
  Rand *local_30;
  double local_28;
  undefined4 local_1c;
  undefined4 local_18;
  byte local_11;
  uint local_10;
  uint local_c;
  code *local_8;
  
  local_11 = in_CL & 1;
  local_18 = 0x100;
  local_1c = 0x80;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_28 = chooseUpToK((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                         (int)in_stack_ffffffffffffff00);
  this = (Rand *)(local_28 * (double)(int)local_10);
  local_30 = this;
  local_38 = pow(2.0,128.0);
  local_38 = (double)this / local_38;
  Rand::Rand(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)0x15f351);
  Blob<256>::Blob(local_80);
  Blob<256>::Blob((Blob<256> *)&stack0xffffffffffffff54);
  Blob<128>::Blob((Blob<128> *)&stack0xffffffffffffff44);
  Blob<128>::Blob((Blob<128> *)&stack0xffffffffffffff34);
  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",local_28,
         (ulong)local_c,0x100,0x80);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",local_30,local_38,
         (ulong)local_10);
  for (local_d0 = 0; local_d0 < (int)local_10; local_d0 = local_d0 + 1) {
    iVar2 = local_d0;
    if (local_d0 % ((int)local_10 / 10) == 0) {
      printf(".");
    }
    Rand::rand_p(this,(void *)CONCAT44(iVar2,in_stack_ffffffffffffff18),
                 (int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
    in_stack_ffffffffffffff10 = local_80;
    Blob<256>::operator=((Blob<256> *)&stack0xffffffffffffff54,in_stack_ffffffffffffff10);
    (*local_8)(in_stack_ffffffffffffff10,0x20,0,&stack0xffffffffffffff44);
    DiffTestRecurse<Blob<256>,Blob<128>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               (Blob<128> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff78);
  }
  printf("\n");
  bVar1 = ProcessDifferentials<Blob<256>>
                    ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)in_stack_ffffffffffffff50,
                     in_stack_ffffffffffffff4c,SUB41(in_stack_ffffffffffffff48,3));
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::~vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)in_stack_ffffffffffffff10);
  return bVar1;
}

Assistant:

bool DiffTest ( pfHash hash, int diffbits, int reps, bool dumpCollisions )
{
  const int keybits = sizeof(keytype) * 8;
  const int hashbits = sizeof(hashtype) * 8;

  double diffcount = chooseUpToK(keybits,diffbits);
  double testcount = (diffcount * double(reps));
  double expected  = testcount / pow(2.0,double(hashbits));

  Rand r(100);

  std::vector<keytype> diffs;

  keytype k1,k2;
  hashtype h1,h2;

  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",
         diffcount,diffbits,keybits,hashbits);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         reps,testcount,expected);

  for(int i = 0; i < reps; i++)
  {
    if(i % (reps/10) == 0) printf(".");

    r.rand_p(&k1,sizeof(keytype));
    k2 = k1;

    hash(&k1,sizeof(k1),0,(uint32_t*)&h1);

    DiffTestRecurse<keytype,hashtype>(hash,k1,k2,h1,h2,0,diffbits,diffs);
  }
  printf("\n");

  bool result = true;

  result &= ProcessDifferentials(diffs,reps,dumpCollisions);

  return result;
}